

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O1

int __thiscall FKeyBindings::GetKeysForCommand(FKeyBindings *this,char *cmd,int *first,int *second)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  uVar3 = 0;
  *second = 0;
  *first = 0;
  iVar4 = 0;
  do {
    iVar1 = strcasecmp(cmd,this->Binds[uVar3].Chars);
    if (iVar1 == 0) {
      bVar5 = iVar4 == 0;
      iVar4 = iVar4 + 1;
      piVar2 = second;
      if (bVar5) {
        piVar2 = first;
      }
      *piVar2 = (int)uVar3;
    }
  } while ((uVar3 < 0x1c3) && (uVar3 = uVar3 + 1, iVar4 < 2));
  return iVar4;
}

Assistant:

int FKeyBindings::GetKeysForCommand (const char *cmd, int *first, int *second)
{
	int c, i;

	*first = *second = c = i = 0;

	while (i < NUM_KEYS && c < 2)
	{
		if (stricmp (cmd, Binds[i]) == 0)
		{
			if (c++ == 0)
				*first = i;
			else
				*second = i;
		}
		i++;
	}
	return c;
}